

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::build_chain_for_empty(Internal *this)

{
  int iVar1;
  uint uVar2;
  Clause *pCVar3;
  uint uVar4;
  unsigned_long in_RAX;
  long lVar5;
  uint64_t id;
  unsigned_long local_38;
  
  if ((this->lrat == true) &&
     ((this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->lrat_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    pCVar3 = this->conflict;
    iVar1 = pCVar3->size;
    local_38 = in_RAX;
    for (lVar5 = 0; (long)iVar1 * 4 != lVar5; lVar5 = lVar5 + 4) {
      uVar2 = *(uint *)((long)&pCVar3[1].field_0 + lVar5);
      uVar4 = uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = -uVar2;
      }
      local_38 = (this->unit_clauses_idx).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)(uVar4 << 1 | -uVar2 >> 0x1f)];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->lrat_chain,&local_38);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->lrat_chain,(value_type_conflict5 *)this->conflict);
  }
  return;
}

Assistant:

void Internal::build_chain_for_empty () {
  if (!lrat || !lrat_chain.empty ())
    return;
  assert (!level);
  assert (lrat_chain.empty ());
  assert (conflict);
  LOG (conflict, "lrat for global empty clause with conflict");
  for (auto &lit : *conflict) {
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    lrat_chain.push_back (id);
  }
  lrat_chain.push_back (conflict->id);
}